

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool IR::Instr::HasSymUseSrc(StackSym *sym,Opnd *src)

{
  bool bVar1;
  RegOpnd *pRVar2;
  IndirOpnd *pIVar3;
  ListOpnd *this;
  ListOpndType *src_00;
  SymOpnd *this_00;
  StackSym *pSVar4;
  PropertySymOpnd *this_01;
  int i;
  int i_00;
  
  if (src != (Opnd *)0x0) {
    bVar1 = Opnd::IsRegOpnd(src);
    if (bVar1) {
      pRVar2 = Opnd::AsRegOpnd(src);
    }
    else {
      bVar1 = Opnd::IsIndirOpnd(src);
      if (!bVar1) {
        bVar1 = Opnd::IsListOpnd(src);
        if (bVar1) {
          this = Opnd::AsListOpnd(src);
          i_00 = 0;
          do {
            if (this->count <= i_00) {
              return false;
            }
            src_00 = ListOpnd::Item(this,i_00);
            bVar1 = HasSymUseSrc(sym,&src_00->super_Opnd);
            i_00 = i_00 + 1;
          } while (!bVar1);
          return true;
        }
        bVar1 = Opnd::IsSymOpnd(src);
        if (!bVar1) {
          return false;
        }
        this_00 = Opnd::AsSymOpnd(src);
        pSVar4 = (StackSym *)Opnd::GetSym(&this_00->super_Opnd);
        if (pSVar4 != sym) {
          bVar1 = SymOpnd::IsPropertySymOpnd(this_00);
          if (!bVar1) {
            return false;
          }
          this_01 = Opnd::AsPropertySymOpnd(&this_00->super_Opnd);
          pSVar4 = PropertySymOpnd::GetObjectSym(this_01);
          if (pSVar4 != sym) {
            return false;
          }
          return true;
        }
        return true;
      }
      pIVar3 = Opnd::AsIndirOpnd(src);
      if ((pIVar3->m_baseOpnd != (RegOpnd *)0x0) && (pIVar3->m_baseOpnd->m_sym == sym)) {
        return true;
      }
      pRVar2 = pIVar3->m_indexOpnd;
      if (pRVar2 == (RegOpnd *)0x0) {
        return false;
      }
    }
    if (pRVar2->m_sym == sym) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
Instr::HasSymUseSrc(StackSym *sym, IR::Opnd* src)
{
    if (!src)
    {
        return false;
    }
    if (src->IsRegOpnd())
    {
        RegOpnd *regOpnd = src->AsRegOpnd();

        if (regOpnd->m_sym == sym)
        {
            return true;
        }
    }
    else if (src->IsIndirOpnd())
    {
        IR::IndirOpnd *indirOpnd = src->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        if (baseOpnd != nullptr && baseOpnd->m_sym == sym)
        {
            return true;
        }
        else if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == sym)
        {
            return true;
        }
    }
    else if (src->IsListOpnd())
    {
        IR::ListOpnd* list = src->AsListOpnd();
        for (int i = 0; i < list->Count(); ++i)
        {
            if (HasSymUseSrc(sym, list->Item(i)))
            {
                return true;
            }
        }
    }
    else if (src->IsSymOpnd())
    {
        SymOpnd* symOpnd = src->AsSymOpnd();
        if (symOpnd->GetSym() == sym)
        {
            return true;
        }
        if (symOpnd->IsPropertySymOpnd())
        {
            PropertySymOpnd* propertySymOpnd = symOpnd->AsPropertySymOpnd();
            if (propertySymOpnd->GetObjectSym() == sym)
            {
                return true;
            }
        }
    }
    return false;
}